

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

HelperCallOpnd *
Lowerer::CreateHelperCallOpnd(JnHelperMethod helperMethod,int helperArgCount,Func *func)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  HelperCallOpnd *pHVar4;
  
  if (func == (Func *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x615b,"(func)","func");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  if (DAT_0159ef8c == '\x01') {
    bVar2 = Func::IsJitInDebugMode(func);
    if (bVar2) {
      bVar2 = HelperMethodAttributes::CanThrow(helperMethod);
      if (bVar2) {
        pHVar4 = &IR::DiagHelperCallOpnd::New(helperMethod,func,helperArgCount)->
                  super_HelperCallOpnd;
        return pHVar4;
      }
    }
  }
  pHVar4 = IR::HelperCallOpnd::New(helperMethod,func);
  return pHVar4;
}

Assistant:

IR::HelperCallOpnd*
Lowerer::CreateHelperCallOpnd(IR::JnHelperMethod helperMethod, int helperArgCount, Func* func)
{
    Assert(func);

    IR::HelperCallOpnd* helperCallOpnd;
    if (CONFIG_FLAG(EnableContinueAfterExceptionWrappersForHelpers) &&
        func->IsJitInDebugMode() &&
        HelperMethodAttributes::CanThrow(helperMethod))
    {
        // Create DiagHelperCallOpnd to indicate that it's needed to wrap original helper with try-catch wrapper,
        // so that we can ignore exception and bailout to next stmt in debugger.
        // For details, see: Lib\Runtime\Debug\DiagHelperMethodWrapper.{h,cpp}.
        helperCallOpnd = IR::DiagHelperCallOpnd::New(helperMethod, func, helperArgCount);
    }
    else
    {
         helperCallOpnd = IR::HelperCallOpnd::New(helperMethod, func);
    }

    return helperCallOpnd;
}